

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateFieldOptions
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  Type TVar4;
  Descriptor *pDVar5;
  MessageOptions *this_00;
  MessageOptions *pMVar6;
  string *__lhs;
  FieldDescriptorProto *in_RSI;
  FieldDescriptor *in_RDI;
  DescriptorBuilder *unaff_retaddr;
  ErrorLocation in_stack_0000000c;
  Message *in_stack_00000010;
  string *in_stack_00000018;
  DescriptorBuilder *in_stack_00000020;
  FieldDescriptorProto *in_stack_00000038;
  FieldDescriptor *in_stack_00000040;
  DescriptorBuilder *in_stack_00000048;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  FieldDescriptor *in_stack_ffffffffffffffa0;
  bool local_52;
  bool local_51;
  FieldDescriptor *in_stack_ffffffffffffffb0;
  bool local_39;
  string *in_stack_ffffffffffffffc8;
  
  if (((*(byte *)(*(long *)in_RDI + 0x29) & 1) == 0) ||
     ((in_RSI != (FieldDescriptorProto *)0x0 &&
      (pDVar5 = FieldDescriptor::message_type(in_stack_ffffffffffffffa0),
      pDVar5 != (Descriptor *)0x0)))) {
    FieldDescriptor::options((FieldDescriptor *)in_RSI);
    bVar3 = FieldOptions::lazy((FieldOptions *)0x4c0a05);
    if ((bVar3) && (TVar4 = FieldDescriptor::type(in_stack_ffffffffffffffb0), TVar4 != TYPE_MESSAGE)
       ) {
      FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)in_RSI);
      AddError(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
               (char *)unaff_retaddr);
    }
    FieldDescriptor::options((FieldDescriptor *)in_RSI);
    bVar3 = FieldOptions::packed((FieldOptions *)0x4c0a56);
    if ((bVar3) && (bVar3 = FieldDescriptor::is_packable(in_stack_ffffffffffffffa0), !bVar3)) {
      FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)in_RSI);
      AddError(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
               (char *)unaff_retaddr);
    }
    lVar1._0_4_ = in_RSI->label_;
    lVar1._4_4_ = in_RSI->type_;
    if (lVar1 != 0) {
      pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)in_RSI);
      this_00 = Descriptor::options(pDVar5);
      pMVar6 = MessageOptions::default_instance();
      if (this_00 != pMVar6) {
        pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)in_RSI);
        Descriptor::options(pDVar5);
        bVar3 = MessageOptions::message_set_wire_format((MessageOptions *)0x4c0ae9);
        if (bVar3) {
          bVar3 = FieldDescriptor::is_extension((FieldDescriptor *)in_RSI);
          if (bVar3) {
            bVar3 = FieldDescriptor::is_optional((FieldDescriptor *)0x4c0b0c);
            if ((!bVar3) ||
               (TVar4 = FieldDescriptor::type((FieldDescriptor *)this_00), TVar4 != TYPE_MESSAGE)) {
              FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)in_RSI);
              AddError(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                       (char *)unaff_retaddr);
            }
          }
          else {
            FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)in_RSI);
            AddError(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                     (char *)unaff_retaddr);
          }
        }
      }
    }
    FieldDescriptor::file((FieldDescriptor *)in_RSI);
    bVar3 = IsLite((FileDescriptor *)in_stack_ffffffffffffffa0);
    if ((bVar3) && (lVar2._0_4_ = in_RSI->label_, lVar2._4_4_ = in_RSI->type_, lVar2 != 0)) {
      pDVar5 = FieldDescriptor::containing_type((FieldDescriptor *)in_RSI);
      Descriptor::file(pDVar5);
      bVar3 = IsLite((FileDescriptor *)in_stack_ffffffffffffffa0);
      if (!bVar3) {
        FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)in_RSI);
        AddError(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
                 (char *)unaff_retaddr);
      }
    }
    bVar3 = FieldDescriptor::is_map(in_stack_ffffffffffffffa0);
    if ((bVar3) &&
       (bVar3 = ValidateMapEntry(in_stack_00000048,in_stack_00000040,in_stack_00000038), !bVar3)) {
      FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)in_RSI);
      AddError(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
               (char *)unaff_retaddr);
    }
    ValidateJSType(unaff_retaddr,in_RDI,in_RSI);
    bVar3 = FieldDescriptor::is_extension((FieldDescriptor *)in_RSI);
    local_39 = false;
    local_51 = false;
    if (bVar3) {
      local_39 = FieldDescriptor::has_json_name((FieldDescriptor *)in_RSI);
      local_52 = false;
      if (local_39) {
        __lhs = FieldDescriptor::json_name_abi_cxx11_((FieldDescriptor *)in_RSI);
        FieldDescriptor::name_abi_cxx11_((FieldDescriptor *)in_RSI);
        anon_unknown_1::ToJsonName(in_stack_ffffffffffffffc8);
        local_52 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)CONCAT17(in_stack_ffffffffffffff9f,
                                                     in_stack_ffffffffffffff98));
      }
      local_51 = local_52;
    }
    if (local_39 != false) {
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    }
    if ((local_51 & 1U) != 0) {
      FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)in_RSI);
      AddError(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_0000000c,
               (char *)unaff_retaddr);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateFieldOptions(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (pool_->lazily_build_dependencies_ && (!field || !field->message_type())) {
    return;
  }
  // Only message type fields may be lazy.
  if (field->options().lazy()) {
    if (field->type() != FieldDescriptor::TYPE_MESSAGE) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "[lazy = true] can only be specified for submessage fields.");
    }
  }

  // Only repeated primitive fields may be packed.
  if (field->options().packed() && !field->is_packable()) {
    AddError(
        field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
        "[packed = true] can only be specified for repeated primitive fields.");
  }

  // Note:  Default instance may not yet be initialized here, so we have to
  //   avoid reading from it.
  if (field->containing_type_ != nullptr &&
      &field->containing_type()->options() !=
          &MessageOptions::default_instance() &&
      field->containing_type()->options().message_set_wire_format()) {
    if (field->is_extension()) {
      if (!field->is_optional() ||
          field->type() != FieldDescriptor::TYPE_MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "Extensions of MessageSets must be optional messages.");
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "MessageSets cannot have fields, only extensions.");
    }
  }

  // Lite extensions can only be of Lite types.
  if (IsLite(field->file()) && field->containing_type_ != nullptr &&
      !IsLite(field->containing_type()->file())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions to non-lite types can only be declared in non-lite "
             "files.  Note that you cannot extend a non-lite type to contain "
             "a lite type, but the reverse is allowed.");
  }

  // Validate map types.
  if (field->is_map()) {
    if (!ValidateMapEntry(field, proto)) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "map_entry should not be set explicitly. Use map<KeyType, "
               "ValueType> instead.");
    }
  }

  ValidateJSType(field, proto);

  // json_name option is not allowed on extension fields. Note that the
  // json_name field in FieldDescriptorProto is always populated by protoc
  // when it sends descriptor data to plugins (caculated from field name if
  // the option is not explicitly set) so we can't rely on its presence to
  // determine whether the json_name option is set on the field. Here we
  // compare it against the default calculated json_name value and consider
  // the option set if they are different. This won't catch the case when
  // an user explicitly sets json_name to the default value, but should be
  // good enough to catch common misuses.
  if (field->is_extension() &&
      (field->has_json_name() &&
       field->json_name() != ToJsonName(field->name()))) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::OPTION_NAME,
             "option json_name is not allowed on extension fields.");
  }

}